

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoquad.h
# Opt level: O0

void pzgeom::TPZGeoQuad::X<double>(TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZVec<double> *x)

{
  double dVar1;
  int64_t iVar2;
  TPZFMatrix<double> *this;
  double *pdVar3;
  TPZVec<double> *in_RDX;
  TPZBaseMatrix *in_RDI;
  double extraout_XMM0_Qa;
  int j;
  int i;
  int space;
  TPZFNMatrix<8,_double> dphi;
  TPZFNMatrix<4,_double> phi;
  double in_stack_fffffffffffffe20;
  double *in_stack_fffffffffffffe28;
  TPZFNMatrix<8,_double> *in_stack_fffffffffffffe30;
  int local_1c0;
  int local_1bc;
  TPZFMatrix<double> *in_stack_fffffffffffffe70;
  TPZFMatrix<double> *in_stack_fffffffffffffe78;
  TPZVec<double> *in_stack_fffffffffffffe80;
  
  TPZFNMatrix<4,_double>::TPZFNMatrix
            ((TPZFNMatrix<4,_double> *)in_stack_fffffffffffffe30,(int64_t)in_stack_fffffffffffffe28,
             (int64_t)in_stack_fffffffffffffe20);
  TPZFNMatrix<8,_double>::TPZFNMatrix
            (in_stack_fffffffffffffe30,(int64_t)in_stack_fffffffffffffe28,
             (int64_t)in_stack_fffffffffffffe20);
  pztopology::TPZQuadrilateral::TShape<double>
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  iVar2 = TPZBaseMatrix::Rows(in_RDI);
  for (local_1bc = 0; local_1bc < (int)iVar2; local_1bc = local_1bc + 1) {
    this = (TPZFMatrix<double> *)TPZVec<double>::operator[](in_RDX,(long)local_1bc);
    (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)0x0;
    for (local_1c0 = 0; local_1c0 < 4; local_1c0 = local_1c0 + 1) {
      in_stack_fffffffffffffe28 =
           TPZFMatrix<double>::operator()
                     (this,(int64_t)in_stack_fffffffffffffe28,(int64_t)in_stack_fffffffffffffe20);
      dVar1 = *in_stack_fffffffffffffe28;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_1bc,(long)local_1c0);
      in_stack_fffffffffffffe20 = extraout_XMM0_Qa;
      pdVar3 = TPZVec<double>::operator[](in_RDX,(long)local_1bc);
      *pdVar3 = dVar1 * in_stack_fffffffffffffe20 + *pdVar3;
    }
  }
  TPZFNMatrix<8,_double>::~TPZFNMatrix((TPZFNMatrix<8,_double> *)0x1615b7e);
  TPZFNMatrix<4,_double>::~TPZFNMatrix((TPZFNMatrix<4,_double> *)0x1615b8b);
  return;
}

Assistant:

inline void TPZGeoQuad::X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x){
        
        TPZFNMatrix<4,T> phi(NNodes,1);
        TPZFNMatrix<8,T> dphi(2,NNodes);
        TShape(loc,phi,dphi);
        int space = nodes.Rows();
        
        for(int i = 0; i < space; i++) {
            x[i] = 0.0;
            for(int j = 0; j < 4; j++) {
                x[i] += phi(j,0)*nodes.GetVal(i,j);
            }
        }
        
    }